

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

void __thiscall asmjit::v1_14::JitAllocator::JitAllocator(JitAllocator *this,CreateParams *params)

{
  JitAllocatorPrivateImpl *pJVar1;
  long *in_RDI;
  CreateParams *in_stack_00000078;
  
  pJVar1 = JitAllocatorImpl_new(in_stack_00000078);
  *in_RDI = (long)pJVar1;
  if (*in_RDI == 0) {
    *in_RDI = (long)JitAllocatorImpl_none;
  }
  return;
}

Assistant:

JitAllocator::JitAllocator(const CreateParams* params) noexcept {
  _impl = JitAllocatorImpl_new(params);
  if (ASMJIT_UNLIKELY(!_impl))
    _impl = const_cast<JitAllocator::Impl*>(&JitAllocatorImpl_none);
}